

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object.c
# Opt level: O0

object object_create(char *name,accessor_type_id accessor,object_impl impl,
                    object_impl_interface_singleton singleton,klass cls)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  code *in_RCX;
  object_impl in_RDX;
  accessor_type_id in_ESI;
  char *in_RDI;
  klass in_R8;
  size_t obj_name_size;
  object obj;
  object_interface local_58;
  object local_8;
  
  local_8 = (object)malloc(0x30);
  if (local_8 == (object)0x0) {
    local_8 = (object)0x0;
  }
  else {
    if (in_RDI == (char *)0x0) {
      local_8->name = (char *)0x0;
    }
    else {
      sVar2 = strlen(in_RDI);
      pcVar3 = (char *)malloc(sVar2 + 1);
      local_8->name = pcVar3;
      if (local_8->name == (char *)0x0) {
        log_write_impl_va("metacall",0x44,"object_create",
                          "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                          ,LOG_LEVEL_ERROR,"Invalid object name allocation <%s>",in_RDI);
        free(local_8);
        return (object)0x0;
      }
      memcpy(local_8->name,in_RDI,sVar2 + 1);
    }
    local_8->impl = in_RDX;
    local_8->accessor = in_ESI;
    threading_atomic_ref_count_initialize((threading_atomic_ref_count)0x127360);
    if (in_RCX == (code *)0x0) {
      local_58 = (object_interface)0x0;
    }
    else {
      local_58 = (object_interface)(*in_RCX)();
    }
    local_8->interface = local_58;
    local_8->cls = in_R8;
    if (((local_8->interface == (object_interface)0x0) ||
        (local_8->interface->create == (object_impl_interface_create)0x0)) ||
       (iVar1 = (*local_8->interface->create)(local_8,in_RDX), iVar1 == 0)) {
      LOCK();
      object_stats.allocations = object_stats.allocations + 1;
      UNLOCK();
    }
    else {
      log_write_impl_va("metacall",0x5e,"object_create",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/reflect/source/reflect_object.c"
                        ,LOG_LEVEL_ERROR,"Invalid object (%s) create callback <%p>",local_8->name,
                        local_8->interface->create);
      free(local_8->name);
      free(local_8);
      local_8 = (object)0x0;
    }
  }
  return local_8;
}

Assistant:

object object_create(const char *name, enum accessor_type_id accessor, object_impl impl, object_impl_interface_singleton singleton, klass cls)
{
	object obj = malloc(sizeof(struct object_type));

	if (obj == NULL)
	{
		return NULL;
	}

	if (name != NULL)
	{
		size_t obj_name_size = strlen(name) + 1;

		obj->name = malloc(sizeof(char) * obj_name_size);

		if (obj->name == NULL)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object name allocation <%s>", name);

			free(obj);

			return NULL;
		}

		memcpy(obj->name, name, obj_name_size);
	}
	else
	{
		obj->name = NULL;
	}

	obj->impl = impl;
	obj->accessor = accessor;
	threading_atomic_ref_count_initialize(&obj->ref);

	obj->interface = singleton ? singleton() : NULL;

	obj->cls = cls;

	if (obj->interface != NULL && obj->interface->create != NULL)
	{
		if (obj->interface->create(obj, impl) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "Invalid object (%s) create callback <%p>", obj->name, obj->interface->create);

			free(obj->name);
			free(obj);

			return NULL;
		}
	}

	reflect_memory_tracker_allocation(object_stats);

	return obj;
}